

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O0

bool ungroup_selective_undo_allowed_proc(Am_Object *command_obj)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Object local_70;
  Am_Value local_68;
  undefined1 local_58 [8];
  Am_Value value;
  Am_Object local_40 [3];
  Am_Object local_28;
  Am_Object selection_widget;
  Am_Object group;
  Am_Object *command_obj_local;
  
  Am_Object::Am_Object(&selection_widget);
  Am_Object::Am_Object(&local_28);
  Am_Object::Am_Object((Am_Object *)&value.value,command_obj);
  Am_Get_Selection_Widget_For_Command(local_40);
  Am_Object::operator=(&local_28,local_40);
  Am_Object::~Am_Object(local_40);
  Am_Object::~Am_Object((Am_Object *)&value.value);
  Am_Value::Am_Value((Am_Value *)local_58);
  bVar1 = Am_Object::Valid(&local_28);
  if (bVar1) {
    pAVar2 = Am_Object::Get(&local_28,0x193,0);
    Am_Object::operator=(&selection_widget,pAVar2);
    pAVar2 = Am_Object::Peek(command_obj,0x169,0);
    Am_Value::operator=((Am_Value *)local_58,pAVar2);
    Am_Value::Am_Value(&local_68,(Am_Value *)local_58);
    Am_Object::Am_Object(&local_70,&selection_widget);
    command_obj_local._7_1_ = check_all_vis_and_in_group(&local_68,&local_70,false);
    Am_Object::~Am_Object(&local_70);
    Am_Value::~Am_Value(&local_68);
  }
  else {
    command_obj_local._7_1_ = false;
  }
  Am_Value::~Am_Value((Am_Value *)local_58);
  Am_Object::~Am_Object(&local_28);
  Am_Object::~Am_Object(&selection_widget);
  return command_obj_local._7_1_;
}

Assistant:

Am_Define_Method(Am_Selective_Allowed_Method, bool,
                 ungroup_selective_undo_allowed, (Am_Object command_obj))
{
  Am_Object group, selection_widget;
  selection_widget = Am_Get_Selection_Widget_For_Command(command_obj);
  Am_Value value;
  if (selection_widget.Valid()) {
    group = selection_widget.Get(Am_OPERATES_ON);
    value = command_obj.Peek(Am_VALUE); //all the objects in all sub-groups
    return check_all_vis_and_in_group(value, group, false);
  } else
    return false;
}